

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_poll.c
# Opt level: O1

int luv_fs_poll_start(lua_State *L)

{
  uint status;
  uv_fs_poll_t *handle;
  char *path;
  lua_Integer lVar1;
  int iVar2;
  int in_ESI;
  
  handle = luv_check_fs_poll(L,in_ESI);
  path = luaL_checklstring(L,2,(size_t *)0x0);
  iVar2 = 3;
  lVar1 = luaL_checkinteger(L,3);
  luv_check_callback(L,(luv_handle_t *)handle->data,1,4);
  status = uv_fs_poll_start(handle,luv_fs_poll_cb,path,(uint)lVar1);
  if ((int)status < 0) {
    luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(ulong)status);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int luv_fs_poll_start(lua_State* L) {
  uv_fs_poll_t* handle = luv_check_fs_poll(L, 1);
  const char* path = luaL_checkstring(L, 2);
  unsigned int interval = luaL_checkinteger(L, 3);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_FS_POLL, 4);
  ret = uv_fs_poll_start(handle, luv_fs_poll_cb, path, interval);
  return luv_result(L, ret);
}